

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O1

int __thiscall
CTcTokenizer::expand_macros
          (CTcTokenizer *this,CTcTokString *srcbuf,utf8_ptr *src,CTcTokString *expbuf,int read_more,
          int allow_defined,int append)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  tc_toktyp_t tVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  CTcMacroRsc *rsc;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  char **ppcVar10;
  undefined4 in_register_00000084;
  undefined4 in_register_0000008c;
  size_t sVar11;
  size_t sVar12;
  int expanded;
  size_t *local_a0;
  undefined8 local_98;
  tok_embed_ctx *local_90;
  undefined8 local_88;
  utf8_ptr local_src;
  CTcToken tok;
  CTcTokStringRef local_srcbuf;
  CTcHashEntryPp *entry;
  
  local_98 = CONCAT44(in_register_0000008c,allow_defined);
  local_88 = CONCAT44(in_register_00000084,read_more);
  local_src.p_ = (char *)0x0;
  local_srcbuf.super_CTcTokString.buf_len_ = 0;
  local_srcbuf.super_CTcTokString.buf_ = (char *)0x0;
  local_srcbuf.super_CTcTokString.buf_size_ = 0;
  local_srcbuf.super_CTcTokString._vptr_CTcTokString = (_func_int **)&PTR__CTcTokStringRef_00324b98;
  rsc = alloc_macro_rsc(this);
  if (rsc == (CTcMacroRsc *)0x0) {
    iVar9 = 1;
  }
  else {
    if (srcbuf == (CTcTokString *)0x0) {
      ppcVar10 = &local_srcbuf.super_CTcTokString.buf_;
      pcVar2 = src->p_;
      local_srcbuf.super_CTcTokString.buf_len_ = strlen(pcVar2);
      local_srcbuf.super_CTcTokString.buf_size_ = local_srcbuf.super_CTcTokString.buf_len_ + 1;
      srcbuf = &local_srcbuf.super_CTcTokString;
      local_a0 = &local_srcbuf.super_CTcTokString.buf_len_;
      local_srcbuf.super_CTcTokString.buf_ = pcVar2;
    }
    else {
      ppcVar10 = &srcbuf->buf_;
      local_a0 = &srcbuf->buf_len_;
      if (src == (utf8_ptr *)0x0) {
        local_src.p_ = *ppcVar10;
        src = &local_src;
      }
    }
    if (append == 0) {
      (*expbuf->_vptr_CTcTokString[9])();
    }
    (*expbuf->_vptr_CTcTokString[2])(expbuf,*local_a0 + expbuf->buf_len_);
    pcVar2 = src->p_;
    pcVar3 = *ppcVar10;
    local_90 = &this->macro_in_embedding_;
    tVar6 = next_on_line(srcbuf,src,&tok,local_90,1);
    sVar11 = (long)pcVar2 - (long)pcVar3;
    iVar9 = 0;
    do {
      while (sVar12 = tok.text_len_, pcVar2 = tok.text_, tVar6 != TOKT_SYM) {
        if (tVar6 == TOKT_EOF) {
          (*expbuf->_vptr_CTcTokString[4])
                    (expbuf,*ppcVar10 + sVar11,tok.text_ + (-(long)*ppcVar10 - sVar11));
          goto LAB_00222ddf;
        }
LAB_00222bfc:
        tVar6 = next_on_line(srcbuf,src,&tok,local_90,1);
      }
      if ((tok._32_1_ & 1) != 0) goto LAB_00222bfc;
      iVar7 = (*this->defines_->_vptr_CTcMacroTable[4])(this->defines_,tok.text_,tok.text_len_);
      entry = (CTcHashEntryPp *)CONCAT44(extraout_var,iVar7);
      if ((entry == (CTcHashEntryPp *)0x0) ||
         (iVar7 = scan_for_prior_expansion((utf8_ptr)src->p_,*ppcVar10 + *local_a0,entry),
         iVar7 != 0)) {
        tVar6 = TOKT_SYM;
        iVar7 = 0;
        if ((sVar12 == 7 && (int)local_98 != 0) &&
           (*(int *)(pcVar2 + 3) == 0x64656e69 && *(int *)pcVar2 == 0x69666564)) goto LAB_00222b63;
      }
      else {
LAB_00222b63:
        sVar12 = (long)pcVar2 - (long)*ppcVar10;
        if (entry == (CTcHashEntryPp *)0x0) {
          iVar8 = expand_defined(this,&rsc->line_exp_,srcbuf,src);
          expanded = 1;
        }
        else {
          iVar8 = expand_macro(this,rsc,&rsc->line_exp_,srcbuf,src,sVar12,entry,(int)local_88,
                               (int)local_98,&expanded);
        }
        tVar6 = TOKT_SYM;
        iVar7 = 4;
        iVar9 = 1;
        if (iVar8 == 0) {
          if (expanded == 0) {
            tVar6 = next_on_line(srcbuf,src,&tok,local_90,1);
            iVar7 = 2;
            iVar9 = 0;
          }
          else {
            (*expbuf->_vptr_CTcTokString[4])(expbuf,*ppcVar10 + sVar11,sVar12 - sVar11);
            sVar11 = (long)src->p_ - (long)*ppcVar10;
            sVar4 = *local_a0;
            if ((int)local_88 == 0) {
              (*(rsc->line_exp_)._vptr_CTcTokString[4])(rsc,*ppcVar10 + sVar11);
              iVar9 = expand_macros(this,&rsc->line_exp_,(utf8_ptr *)0x0,expbuf,0,(int)local_98,1);
            }
            else {
              lVar1 = (sVar4 - sVar11) + sVar12;
              (*srcbuf->_vptr_CTcTokString[2])(srcbuf,(rsc->line_exp_).buf_len_ + lVar1);
              iVar9 = (*srcbuf->_vptr_CTcTokString[10])();
              src->p_ = (char *)(CONCAT44(extraout_var_00,iVar9) + sVar12);
              iVar9 = (*srcbuf->_vptr_CTcTokString[10])();
              sVar5 = (rsc->line_exp_).buf_len_;
              iVar7 = (*srcbuf->_vptr_CTcTokString[10])();
              memmove((void *)(CONCAT44(extraout_var_01,iVar9) + sVar12 + sVar5),
                      (void *)(CONCAT44(extraout_var_02,iVar7) + sVar11),sVar4 - sVar11);
              iVar9 = (*srcbuf->_vptr_CTcTokString[10])();
              iVar7 = (*(rsc->line_exp_)._vptr_CTcTokString[10])();
              memcpy((void *)(CONCAT44(extraout_var_03,iVar9) + sVar12),
                     (void *)CONCAT44(extraout_var_04,iVar7),(rsc->line_exp_).buf_len_);
              (*srcbuf->_vptr_CTcTokString[0xb])(srcbuf,lVar1 + (rsc->line_exp_).buf_len_);
              tVar6 = next_on_line(srcbuf,src,&tok,local_90,1);
              iVar7 = 2;
              iVar9 = 0;
              sVar11 = sVar12;
            }
          }
        }
      }
      if (iVar7 == 0) goto LAB_00222bfc;
    } while (iVar7 == 2);
LAB_00222ddf:
    rsc->next_avail_ = this->macro_res_avail_;
    this->macro_res_avail_ = rsc;
  }
  return iVar9;
}

Assistant:

int CTcTokenizer::expand_macros(CTcTokString *srcbuf, utf8_ptr *src,
                                CTcTokString *expbuf, int read_more,
                                int allow_defined, int append)
{
    tc_toktyp_t typ;
    CTcToken tok;
    CTcTokString *subexp;
    size_t startofs;
    utf8_ptr local_src;
    CTcTokStringRef local_srcbuf;
    CTcMacroRsc *res;
    int err;

    /* presume success */
    err = 0;

    /* get a macro expansion resource object */
    res = alloc_macro_rsc();
    if (res == 0)
        return 1;

    /* get our subexpression buffer from the resource object */
    subexp = &res->line_exp_;

    /* if there's no source buffer or source pointer, provide one */
    if (srcbuf == 0)
    {
        /* 
         *   there's no source buffer - provide our own non-allocated
         *   buffer tied to the caller's buffer 
         */
        local_srcbuf.set_buffer(src->getptr(), strlen(src->getptr()));
        srcbuf = &local_srcbuf;
    }
    else if (src == 0)
    {
        /* 
         *   there's no source pointer - start at the beginning of the
         *   source buffer 
         */
        local_src.set((char *)srcbuf->get_text());
        src = &local_src;
    }

    /* clear the expansion buffer, unless we're appending to the buffer */
    if (!append)
        expbuf->clear_text();

    /* 
     *   Make sure we have room for a copy of the source line.  This is an
     *   optimization for the simple case where we'll just copy the source
     *   line unchanged, so that we don't have to repeatedly expand the
     *   buffer; we will, however, expand the buffer dynamically later, if
     *   this pre-allocation should prove to be insufficient. 
     */
    expbuf->ensure_space(expbuf->get_text_len() + srcbuf->get_text_len());

    /* note the starting offset, if we have an underlying string buffer */
    startofs = src->getptr() - srcbuf->get_text();

    /* read the first token */
    typ = next_on_line(srcbuf, src, &tok, &macro_in_embedding_, TRUE);

    /* scan through the tokens on the line, looking for macros to expand */
    while (typ != TOKT_EOF)
    {
        /* 
         *   if it's a symbol, and it hasn't already been marked as fully
         *   expanded, look it up in the #define table 
         */
        if (typ == TOKT_SYM && !tok.get_fully_expanded())
        {
            CTcHashEntryPp *entry;

            /*
             *   Look up the symbol in the #define symbol table.  If we
             *   find it, expand the macro.  Otherwise, if the "defined"
             *   operator is active, check for that.
             *   
             *   Do not expand the macro if we find that it has already
             *   been expanded on a prior scan through the current text.  
             */
            entry = find_define(tok.get_text(), tok.get_text_len());
            if ((entry != 0
                 && !scan_for_prior_expansion(*src, srcbuf->get_text_end(),
                                              entry))
                || (allow_defined
                    && tok.get_text_len() == 7
                    && memcmp(tok.get_text(), "defined", 7) == 0))
            {
                size_t macro_ofs;
                size_t rem_len;
                int expanded;

                /* get the offset of the macro token in the source buffer */
                macro_ofs = tok.get_text() - srcbuf->get_text();
                
                /* expand it into our sub-expansion buffer */
                if (entry != 0)
                {
                    /* expand the macro */
                    err = expand_macro(res, subexp, srcbuf, src,
                                       macro_ofs, entry,
                                       read_more, allow_defined, &expanded);
                }
                else
                {
                    /* parse and expand the defined() operator */
                    err = expand_defined(subexp, srcbuf, src);

                    /* "defined" always expands if there's not an error */
                    expanded = TRUE;
                }

                /* if an error occurred, return failure */
                if (err)
                    goto done;

                /*
                 *   if we expanded something, append everything we
                 *   skipped preceding the macro, then rescan; otherwise,
                 *   just keep going without a rescan 
                 */
                if (expanded)
                {
                    /* copy the preceding text to the output */
                    expbuf->append(srcbuf->get_text() + startofs,
                                   macro_ofs - startofs);
                }
                else
                {
                    /* 
                     *   we didn't expand - get the next token after the
                     *   macro 
                     */
                    typ = next_on_line(srcbuf, src, &tok,
                                       &macro_in_embedding_, TRUE);

                    /* continue processing from this token */
                    continue;
                }

                /*
                 *   We must now insert the expansion into the source
                 *   buffer at the current point, and re-scan the
                 *   expansion, *along with* the rest of the original
                 *   source line (this is how ANSI C specifies the
                 *   process).
                 *   
                 *   If we can read more, we must be reading out of the
                 *   main input line buffer, so insert the expansion text
                 *   directly into the original source stream, and
                 *   continue reading out of the source stream; this will
                 *   simplify the case where we must read more data from
                 *   the file in the course of the expansion.  If we can't
                 *   read more, simply copy the remainder of the current
                 *   input line onto the expanded macro and use it as the
                 *   new input buffer.  
                 */

                /* get the current offset in the source line */
                startofs = src->getptr() - srcbuf->get_text();

                /* figure out how much is left on the current line */
                rem_len = srcbuf->get_text_len() - startofs;

                /* check to see if we can read more */
                if (read_more)
                {
                    /*
                     *   we're reading from the original line input buffer
                     *   -- insert the expansion into the source buffer at
                     *   the current point, replacing the original macro
                     *   text
                     */
                    
                    /* make sure we have room for adding the expansion text */
                    srcbuf->ensure_space(macro_ofs + rem_len
                                         + subexp->get_text_len());

                    /* make sure src is still pointing to the right place */
                    src->set(srcbuf->get_buf() + macro_ofs);
                
                    /* move the remainder of the current line to make room */
                    memmove(srcbuf->get_buf() + macro_ofs
                            + subexp->get_text_len(),
                            srcbuf->get_buf() + startofs,
                            rem_len);
                
                    /* insert the expansion text */
                    memcpy(srcbuf->get_buf() + macro_ofs, subexp->get_buf(),
                           subexp->get_text_len());
                
                    /* set the new source length */
                    srcbuf->set_text_len(macro_ofs + rem_len
                                         + subexp->get_text_len());

                    /* the new starting offset is the current position */
                    startofs = macro_ofs;

                    /* get the next token */
                    typ = next_on_line(srcbuf, src, &tok,
                                       &macro_in_embedding_, TRUE);
                    
                    /* continue processing from this token */
                    continue;
                }
                else
                {
                    /* 
                     *   we're reading from a read-only buffer -- add the
                     *   remainder of the source to the expansion buffer,
                     *   and recursively parse the remainder 
                     */
                    subexp->append(srcbuf->get_text() + startofs, rem_len);

                    /* 
                     *   evaluate the remainder recursively and append it
                     *   to the expansion already in progress 
                     */
                    err = expand_macros(subexp, 0, expbuf, FALSE,
                                        allow_defined, TRUE);

                    /* we're done */
                    goto done;
                }
            }
        }

        /* get the next token */
        typ = next_on_line(srcbuf, src, &tok, &macro_in_embedding_, TRUE);
    }

    /* add the remainder of the source to the output */
    expbuf->append(srcbuf->get_text() + startofs,
                   tok.get_text() - startofs - srcbuf->get_text());

done:
    /* release our macro resource object */
    release_macro_rsc(res);
    
    /* return the result */
    return err;
}